

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

PNode * add_PNode(Parser *p,int symbol,d_loc_t *start_loc,char *e,PNode *pn,D_Reduction *r,
                 VecZNode *path,D_Shift *sh)

{
  PNode *pPVar1;
  int iVar2;
  uint32 uVar3;
  PNode *x;
  PNode *_t;
  PNode *amb;
  PNode *new_pn;
  PNode *old_pn;
  D_Scope *pDStack_50;
  uint hash;
  D_Scope *scope;
  D_Reduction *r_local;
  PNode *pn_local;
  char *e_local;
  d_loc_t *start_loc_local;
  Parser *pPStack_20;
  int symbol_local;
  Parser *p_local;
  
  scope = (D_Scope *)r;
  r_local = (D_Reduction *)pn;
  pn_local = (PNode *)e;
  e_local = (char *)start_loc;
  start_loc_local._4_4_ = symbol;
  pPStack_20 = p;
  pDStack_50 = equiv_D_Scope((pn->parse_node).scope);
  new_pn = find_PNode(pPStack_20,*(char **)e_local,(char *)pn_local,start_loc_local._4_4_,pDStack_50
                      ,(uint *)((long)&old_pn + 4));
  if (new_pn != (PNode *)0x0) {
    iVar2 = PNode_equal(pPStack_20,new_pn,(D_Reduction *)scope,path,sh);
    if (iVar2 != 0) {
      return new_pn;
    }
    for (_t = new_pn->ambiguities; _t != (PNode *)0x0; _t = _t->ambiguities) {
      iVar2 = PNode_equal(pPStack_20,_t,(D_Reduction *)scope,path,sh);
      if (iVar2 != 0) {
        return new_pn;
      }
    }
  }
  x = make_PNode(pPStack_20,old_pn._4_4_,start_loc_local._4_4_,(d_loc_t *)e_local,(char *)pn_local,
                 (PNode *)r_local,(D_Reduction *)scope,path,sh,pDStack_50);
  if (new_pn == (PNode *)0x0) {
    if (x == (PNode *)0x0) {
      return (PNode *)0x0;
    }
    insert_PNode(pPStack_20,x);
    new_pn = x;
  }
  else if (x != (PNode *)0x0) {
    pPStack_20->compares = pPStack_20->compares + 1;
    iVar2 = cmp_pnodes(pPStack_20,x,new_pn);
    if (iVar2 == -1) {
      insert_PNode(pPStack_20,x);
      while (new_pn->latest != new_pn->latest->latest) {
        pPVar1 = new_pn->latest->latest;
        pPVar1->refcount = pPVar1->refcount + 1;
        uVar3 = new_pn->latest->refcount - 1;
        new_pn->latest->refcount = uVar3;
        if (uVar3 == 0) {
          free_PNode(pPStack_20,new_pn->latest);
        }
        new_pn->latest = pPVar1;
      }
      pPVar1 = new_pn->latest;
      x->refcount = x->refcount + 1;
      pPVar1->latest = x;
      new_pn = x;
    }
    else if (iVar2 == 0) {
      x->refcount = x->refcount + 1;
      x->ambiguities = new_pn->ambiguities;
      new_pn->ambiguities = x;
    }
    else if (iVar2 == 1) {
      free_PNode(pPStack_20,x);
    }
  }
  return new_pn;
}

Assistant:

static PNode *add_PNode(Parser *p, int symbol, d_loc_t *start_loc, char *e, PNode *pn, D_Reduction *r, VecZNode *path,
                        D_Shift *sh) {
  D_Scope *scope = equiv_D_Scope(pn->parse_node.scope);
  uint hash;
  PNode *old_pn = find_PNode(p, start_loc->s, e, symbol, scope, &hash), *new_pn;
  if (old_pn) {
    PNode *amb = 0;
    if (PNode_equal(p, old_pn, r, path, sh)) return old_pn;
    for (amb = old_pn->ambiguities; amb; amb = amb->ambiguities) {
      if (PNode_equal(p, amb, r, path, sh)) return old_pn;
    }
  }
  new_pn = make_PNode(p, hash, symbol, start_loc, e, pn, r, path, sh, scope);
  if (!old_pn) {
    old_pn = new_pn;
    if (!new_pn) return NULL;
    insert_PNode(p, new_pn);
    goto Lreturn;
  }
  if (!new_pn) goto Lreturn;
  p->compares++;
  switch (cmp_pnodes(p, new_pn, old_pn)) {
    case 0:
      ref_pn(new_pn);
      new_pn->ambiguities = old_pn->ambiguities;
      old_pn->ambiguities = new_pn;
      break;
    case -1:
      insert_PNode(p, new_pn);
      LATEST(p, old_pn);
      ref_pn(new_pn);
      old_pn->latest = new_pn;
      old_pn = new_pn;
      break;
    case 1:
      free_PNode(p, new_pn);
      break;
  }
Lreturn:
  return old_pn;
}